

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLiSample * __thiscall
pbrt::GoniometricLight::SampleLi
          (LightLiSample *__return_storage_ptr__,GoniometricLight *this,LightSampleContext ctx,
          Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  Interval<float> IVar2;
  bool bVar3;
  float fVar4;
  undefined1 auVar5 [16];
  Point3fi *pPVar6;
  Point3fi *pPVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [56];
  undefined1 auVar30 [16];
  Vector3f wl;
  SampledSpectrum SVar31;
  undefined4 local_48;
  undefined1 auVar20 [56];
  undefined1 auVar28 [64];
  
  auVar17 = ZEXT816(0) << 0x40;
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar17,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar17,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar5 = vfmadd231ss_fma(auVar5,auVar17,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar16 = vfmadd231ss_fma(auVar16,auVar17,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar11 = auVar16._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar4 = auVar5._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  bVar3 = fVar11 == 1.0;
  uVar8 = 0xff;
  if (!bVar3) {
    uVar8 = 0;
  }
  uVar9 = (ulong)uVar8;
  if (NAN(fVar11)) {
    uVar9 = 0;
  }
  fVar10 = (float)((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar11));
  auVar5 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  fVar4 = fVar10 + (ctx.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                   ctx.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * -0.5;
  auVar23._0_4_ = auVar12._0_4_ * 0.0;
  auVar23._4_4_ = auVar12._4_4_ * 0.0;
  auVar23._8_4_ = auVar12._8_4_ * 0.0;
  auVar23._12_4_ = auVar12._12_4_ * 0.0;
  auVar5 = vfmadd213ps_fma(auVar5,ZEXT816(0) << 0x20,auVar23);
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  auVar5 = vfmadd213ps_fma(auVar12,ZEXT816(0) << 0x20,auVar5);
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][3]),0x10);
  auVar16._0_4_ = auVar12._0_4_ + auVar5._0_4_;
  auVar16._4_4_ = auVar12._4_4_ + auVar5._4_4_;
  auVar16._8_4_ = auVar12._8_4_ + auVar5._8_4_;
  auVar16._12_4_ = auVar12._12_4_ + auVar5._12_4_;
  auVar24._4_4_ = fVar11;
  auVar24._0_4_ = fVar11;
  auVar24._8_4_ = fVar11;
  auVar24._12_4_ = fVar11;
  auVar12 = vdivps_avx(auVar16,auVar24);
  auVar5 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  bVar3 = (bool)((byte)uVar9 & 1);
  fVar11 = (float)((uint)bVar3 * (int)auVar16._0_4_ | (uint)!bVar3 * auVar12._0_4_);
  bVar3 = (bool)((byte)(uVar9 >> 1) & 1);
  fVar13 = (float)((uint)bVar3 * (int)auVar16._4_4_ | (uint)!bVar3 * auVar12._4_4_);
  bVar3 = (bool)((byte)(uVar9 >> 2) & 1);
  fVar14 = (float)((uint)bVar3 * (int)auVar16._8_4_ | (uint)!bVar3 * auVar12._8_4_);
  bVar3 = (bool)((byte)(uVar9 >> 3) & 1);
  fVar15 = (float)((uint)bVar3 * (int)auVar16._12_4_ | (uint)!bVar3 * auVar12._12_4_);
  auVar17._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar5._0_4_;
  auVar17._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar5._4_4_;
  auVar17._8_4_ = auVar5._8_4_ + 0.0;
  auVar17._12_4_ = auVar5._12_4_ + 0.0;
  auVar12._8_4_ = 0xbf000000;
  auVar12._0_8_ = 0xbf000000bf000000;
  auVar12._12_4_ = 0xbf000000;
  auVar12 = vmulps_avx512vl(auVar17,auVar12);
  auVar18._0_4_ = fVar11 + auVar12._0_4_;
  auVar18._4_4_ = fVar13 + auVar12._4_4_;
  auVar18._8_4_ = fVar14 + auVar12._8_4_;
  auVar18._12_4_ = fVar15 + auVar12._12_4_;
  auVar25._0_4_ = auVar18._0_4_ * auVar18._0_4_;
  auVar25._4_4_ = auVar18._4_4_ * auVar18._4_4_;
  auVar25._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar25._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar12 = vmovshdup_avx(auVar25);
  auVar12 = vfmadd231ss_fma(auVar12,auVar18,auVar18);
  auVar16 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  auVar12 = vsqrtss_avx(auVar16,auVar16);
  fVar21 = auVar12._0_4_;
  auVar30._4_4_ = fVar21;
  auVar30._0_4_ = fVar21;
  auVar30._8_4_ = fVar21;
  auVar30._12_4_ = fVar21;
  auVar23 = ZEXT416((uint)(fVar4 / fVar21));
  auVar12 = vdivps_avx(auVar18,auVar30);
  auVar5 = vmovshdup_avx(auVar12);
  fVar22 = auVar5._0_4_;
  auVar5 = vfnmsub231ss_fma(ZEXT416((uint)(fVar22 * (this->super_LightBase).renderFromLight.mInv.m
                                                    [0][1])),auVar12,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar17 = vfnmsub231ss_fma(ZEXT416((uint)(fVar22 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [1][1])),auVar12,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar18 = vfnmsub231ss_fma(ZEXT416((uint)(fVar22 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [2][1])),auVar12,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar5 = vfnmadd231ss_fma(auVar5,auVar23,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar17 = vfnmadd231ss_fma(auVar17,auVar23,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar18 = vfnmadd231ss_fma(auVar18,auVar23,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  auVar5 = vinsertps_avx(auVar5,auVar17,0x10);
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar5._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
  auVar29 = ZEXT856(auVar18._8_8_);
  auVar20 = ZEXT856(auVar5._8_8_);
  SVar31 = Scale(this,wl,&lambda);
  auVar28._0_8_ = SVar31.values.values._8_8_;
  auVar28._8_56_ = auVar29;
  auVar19._0_8_ = SVar31.values.values._0_8_;
  auVar19._8_56_ = auVar20;
  auVar5 = vmovlhps_avx(auVar19._0_16_,auVar28._0_16_);
  local_48 = auVar16._0_4_;
  auVar26._4_4_ = local_48;
  auVar26._0_4_ = local_48;
  auVar26._8_4_ = local_48;
  auVar26._12_4_ = local_48;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (__return_storage_ptr__->pLight).uv.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x0;
  auVar5 = vdivps_avx(auVar5,auVar26);
  auVar27._4_4_ = fVar10;
  auVar27._0_4_ = fVar10;
  auVar27._8_4_ = fVar10;
  auVar27._12_4_ = fVar10;
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar5;
  uVar1 = vmovlps_avx(auVar12);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  auVar5._4_4_ = fVar13;
  auVar5._0_4_ = fVar11;
  auVar5._8_4_ = fVar14;
  auVar5._12_4_ = fVar15;
  auVar12 = vpermilps_avx(auVar5,0x50);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = fVar4 / fVar21;
  __return_storage_ptr__->pdf = 1.0;
  (__return_storage_ptr__->light).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (ulong)this | 0x4000000000000;
  pPVar6 = &(__return_storage_ptr__->pLight).pi;
  pPVar7 = &(__return_storage_ptr__->pLight).pi;
  (pPVar6->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.low = (float)(int)auVar12._0_8_;
  (pPVar6->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = (float)(int)auVar12._8_8_;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.high = (float)(int)((ulong)auVar12._8_8_ >> 0x20);
  IVar2 = (Interval<float>)vmovlps_avx(auVar27);
  (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar2;
  (__return_storage_ptr__->pLight).time = 0.0;
  (__return_storage_ptr__->pLight).mediumInterface = &(this->super_LightBase).mediumInterface;
  (__return_storage_ptr__->pLight).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  return __return_storage_ptr__;
}

Assistant:

LightLiSample GoniometricLight::SampleLi(LightSampleContext ctx, Point2f u,
                                         SampledWavelengths lambda,
                                         LightSamplingMode mode) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    SampledSpectrum L =
        Scale(renderFromLight.ApplyInverse(-wi), lambda) / DistanceSquared(p, ctx.p());
    return LightLiSample(this, L, wi, 1, Interaction(p, 0 /* time */, &mediumInterface));
}